

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O3

stat_elem * __thiscall nuraft::stat_mgr::get_stat(stat_mgr *this,string *stat_name)

{
  iterator iVar1;
  stat_elem *psVar2;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->stat_map_lock_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
          ::find(&(this->stat_map_)._M_t,stat_name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->stat_map_)._M_t._M_impl.super__Rb_tree_header) {
    psVar2 = (stat_elem *)0x0;
  }
  else {
    psVar2 = *(stat_elem **)(iVar1._M_node + 2);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return psVar2;
}

Assistant:

stat_elem* stat_mgr::get_stat(const std::string& stat_name) {
    std::unique_lock<std::mutex> l(stat_map_lock_);
    auto entry = stat_map_.find(stat_name);
    if (entry == stat_map_.end()) {
        // Not exist.
        return nullptr;
    }
    return entry->second;
}